

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_create(char *filename,int *handle)

{
  int iVar1;
  size_t sVar2;
  FILE *pFVar3;
  int *in_RSI;
  char *in_RDI;
  char userroot2 [1025];
  char userroot [1025];
  char username [1025];
  char rootstring2 [256];
  char rootstring [256];
  char absURL [1025];
  char cwd [1025];
  char *cpos;
  char *cptr;
  int slen;
  int rootlen2;
  int rootlen;
  int status;
  char mode [4];
  int ii;
  FILE *diskfile;
  char acStack_1698 [1032];
  int *in_stack_ffffffffffffed70;
  char *in_stack_ffffffffffffed78;
  int *in_stack_ffffffffffffed90;
  char *in_stack_ffffffffffffed98;
  char *in_stack_ffffffffffffeda0;
  char *in_stack_ffffffffffffeda8;
  char local_e78 [50];
  undefined1 local_e46;
  char local_a68 [256];
  char local_968 [256];
  char local_868 [1040];
  char local_458 [1040];
  char *local_48;
  char *local_40;
  int local_38;
  int local_34;
  int local_30;
  undefined4 local_2c;
  char local_28 [4];
  int local_24;
  FILE *local_20;
  int *local_18;
  char *local_10;
  int local_4;
  
  local_2c = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = getenv("HERA_DATA_DIRECTORY");
  if (local_40 != (char *)0x0) {
    sVar2 = strlen(local_40);
    if (200 < sVar2) {
      return 0x69;
    }
    strcpy(local_968,local_40);
    local_48 = strchr(local_968,0x3b);
    if (local_48 == (char *)0x0) {
      local_a68[0] = '\0';
      local_48 = (char *)0x0;
    }
    else {
      *local_48 = '\0';
      local_48 = local_48 + 1;
      strcpy(local_a68,local_48);
    }
    fits_get_cwd(in_stack_ffffffffffffed78,in_stack_ffffffffffffed70);
    sVar2 = strlen(local_458);
    local_38 = (int)sVar2;
    if ((local_38 < 0x401) && (local_458[local_38 + -1] != '/')) {
      strcat(local_458,"/");
    }
    sVar2 = strlen(local_968);
    local_30 = (int)sVar2;
    iVar1 = strncmp(local_968,local_458,(long)local_30);
    if (iVar1 != 0) {
      ffpmsg((char *)0x122ca7);
      return 0x69;
    }
    strncpy(local_e78,local_458 + local_30,0x32);
    local_e46 = 0;
    local_48 = strchr(local_e78,0x2f);
    if (local_48 == (char *)0x0) {
      ffpmsg((char *)0x122d15);
      return 0x69;
    }
    local_48[1] = '\0';
    strcpy(&stack0xffffffffffffed78,local_968);
    strcat(&stack0xffffffffffffed78,local_e78);
    sVar2 = strlen(&stack0xffffffffffffed78);
    local_30 = (int)sVar2;
    strcpy(acStack_1698,local_a68);
    strcat(acStack_1698,local_e78);
    sVar2 = strlen(acStack_1698);
    local_34 = (int)sVar2;
    fits_relurl2url(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,
                    in_stack_ffffffffffffed90);
    iVar1 = strncmp(&stack0xffffffffffffed78,local_868,(long)local_30);
    if ((iVar1 != 0) && (iVar1 = strncmp(acStack_1698,local_868,(long)local_34), iVar1 != 0)) {
      ffpmsg((char *)0x122e0e);
      return 0x69;
    }
  }
  *local_18 = -1;
  local_24 = 0;
  do {
    if (9999 < local_24) {
LAB_00122e8e:
      if (*local_18 == -1) {
        local_4 = 0x67;
      }
      else {
        strcpy(local_28,"w+b");
        local_20 = fopen64(local_10,"r");
        if (local_20 == (FILE *)0x0) {
          pFVar3 = fopen64(local_10,local_28);
          if (pFVar3 == (FILE *)0x0) {
            local_4 = 0x69;
          }
          else {
            handleTable[local_24].fileptr = (FILE *)pFVar3;
            handleTable[local_24].currentpos = 0;
            handleTable[local_24].last_io_op = 0;
            local_4 = 0;
          }
        }
        else {
          fclose(local_20);
          local_4 = 0x69;
        }
      }
      return local_4;
    }
    if (handleTable[local_24].fileptr == (FILE *)0x0) {
      *local_18 = local_24;
      goto LAB_00122e8e;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int file_create(char *filename, int *handle)
{
    FILE *diskfile;
    int ii;
#if defined(_WIN32)
    wchar_t mode[4];
#else
    char mode[4];
#endif
 
    int status = 0, rootlen, rootlen2, slen;
    char *cptr, *cpos;
    char cwd[FLEN_FILENAME], absURL[FLEN_FILENAME];
    char rootstring[256], rootstring2[256];
    char username[FLEN_FILENAME], userroot[FLEN_FILENAME], userroot2[FLEN_FILENAME];

    cptr = getenv("HERA_DATA_DIRECTORY");
    if (cptr) {
	/* This environment variable is defined in the Hera data analysis environment. */
	/* It specifies the root directory path to the users data directories.  */
	/* CFITSIO will verify that the path to the file that is to be created */
	/* is within this root directory + the user's home directory name. */

/*
printf("env = %s\n",cptr);
*/	
        if (strlen(cptr) > 200)  /* guard against possible string overflows */
	    return(FILE_NOT_CREATED); 

	/* environment variable has the form "path/one/;/path/two/" where the */
	/* second path is optional */

	strcpy(rootstring, cptr);
	cpos = strchr(rootstring, ';');
	if (cpos) {
	    *cpos = '\0';
	    cpos++;
	    strcpy(rootstring2, cpos);
	} else {
	  *rootstring2 = '\0';
	}
/*
printf("%s, %s\n", rootstring, rootstring2);
printf("CWD = %s\n", cwd); 
printf("rootstring=%s, cwd=%s.\n", rootstring, cwd);
*/
	/* Get the current working directory */
	fits_get_cwd(cwd, &status);  
	slen = strlen(cwd);
	if ((slen < FLEN_FILENAME) && cwd[slen-1] != '/') strcat(cwd,"/"); /* make sure the CWD ends with slash */


	/* check that CWD string matches the rootstring */
	rootlen = strlen(rootstring);
	if (strncmp(rootstring, cwd, rootlen)) {
	    ffpmsg("invalid CWD: does not match root data directory");
	    return(FILE_NOT_CREATED); 
	} else {

	    /* get the user name from CWD (it follows the root string) */
	    strncpy(username, cwd+rootlen, 50);  /* limit length of user name */
            username[50]=0;
	    cpos=strchr(username, '/');
	    if (!cpos) {
               ffpmsg("invalid CWD: not equal to root data directory + username");
               return(FILE_NOT_CREATED); 
	    } else {
	        *(cpos+1) = '\0';   /* truncate user name string */

		/* construct full user root name */
		strcpy(userroot, rootstring);
		strcat(userroot, username);
		rootlen = strlen(userroot);

		/* construct alternate full user root name */
		strcpy(userroot2, rootstring2);
		strcat(userroot2, username);
		rootlen2 = strlen(userroot2);

		/* convert the input filename to absolute path relative to the CWD */
		fits_relurl2url(cwd,  filename,  absURL, &status);

/*
printf("username = %s\n", username);
printf("userroot = %s\n", userroot);
printf("userroot2 = %s\n", userroot2);
printf("filename = %s\n", filename);
printf("ABS = %s\n", absURL);
*/
		/* check that CWD string matches the rootstring or alternate root string */

		if ( strncmp(userroot,  absURL, rootlen)  &&
		   strncmp(userroot2, absURL, rootlen2) ) {
		   ffpmsg("invalid filename: path not within user directory");
		   return(FILE_NOT_CREATED); 
		}
	    }
	}
	/* if we got here, then the input filename appears to be valid */
    }
    
    *handle = -1;
    for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in table */
    {
        if (handleTable[ii].fileptr == 0)
        {
            *handle = ii;
            break;
        }
    }
    if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

#if defined(_WIN32)
    wcscpy(mode, L"w+b");    /* create new file with read-write */
    /* Windows
    *
    *  Assume that the input filename is in UTF-8 encoding and convert to UTF-16.
    */
    UINT inputCodePage = CP_UTF8;
    /*
    *  For UTF-8, dwFlags must be set to either 0 or
    *  MB_ERR_INVALID_CHARS.
    */
    DWORD flags = 0;
    int outputLength = 0, rc = 0;

    /*
    *  Call MultiByteToWideChar with an output buffer size of zero to determine
    *  how large an output buffer is actually necessary.
    */
    outputLength = MultiByteToWideChar(
        inputCodePage,
        flags,
        filename,
        -1,
        NULL,
        0
    );

    /*
    *  Actually convert the file name to UTF-16
    */
    wchar_t* wideFilename = (wchar_t*)malloc(sizeof(wchar_t) * outputLength);

    rc = MultiByteToWideChar(
        inputCodePage,
        flags,
        filename,
        -1,
        wideFilename,
        outputLength
    );
    
    if (0 == rc) return (FILE_NOT_CREATED);

#else
    strcpy(mode, "w+b");    /* create new file with read-write */
#endif

#if defined(_WIN32)
    diskfile = _wfopen(wideFilename, L"r");  /* does file already exist? */
    if (diskfile)
    {
        fclose(diskfile);         /* close file and exit with error */
        free(wideFilename);
        return(FILE_NOT_CREATED); 
    }
#else
    diskfile = fopen(filename, "r"); /* does file already exist? */
    if (diskfile)
    {
        fclose(diskfile);         /* close file and exit with error */
        return(FILE_NOT_CREATED); 
    }
#endif

#if MACHINE == ALPHAVMS || MACHINE == VAXVMS
        /* specify VMS record structure: fixed format, 2880 byte records */
        /* but force stream mode access to enable random I/O access      */
    diskfile = fopen(filename, mode, "rfm=fix", "mrs=2880", "ctx=stm"); 
#elif defined (_WIN32)
    diskfile = _wfopen(wideFilename, mode);
    free(wideFilename);
#else
    diskfile = fopen(filename, mode); 
#endif

    if (!(diskfile))           /* couldn't create file */
    {
            return(FILE_NOT_CREATED); 
    }

    handleTable[ii].fileptr = diskfile;
    handleTable[ii].currentpos = 0;
    handleTable[ii].last_io_op = IO_SEEK;

    return(0);
}